

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMemCheckHandler::PostProcessBoundsCheckerTest
          (cmCTestMemCheckHandler *this,cmCTestTestResult *res,int test)

{
  uint uVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  string *psVar6;
  string ofile;
  string log;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string line;
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  long *local_3d0;
  long local_3c0 [2];
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [112];
  ios_base local_1c8 [408];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,"PostProcessBoundsCheckerTest for : ",0x23);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_238,(res->Name)._M_dataplus._M_p,(res->Name)._M_string_length
                     );
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x50d,(char *)local_3b0._0_8_,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,
                    CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,local_3a0[0]._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TestOutputFileNames(this,test,&local_3e8);
  if (local_3e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    pcVar3 = ((local_3e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_428,pcVar3,
               pcVar3 + (local_3e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    if (local_428._M_string_length != 0) {
      std::ifstream::ifstream(local_238,local_428._M_dataplus._M_p,_S_in);
      uVar1 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20));
      if ((uVar1 & 5) == 0) {
        psVar6 = &res->Output;
        std::__cxx11::string::append((char *)psVar6);
        std::__cxx11::string::append((char *)psVar6);
        local_3b0._8_8_ = 0;
        local_3a0[0]._M_local_buf[0] = '\0';
        local_3b0._0_8_ = local_3b0 + 0x10;
        while (bVar4 = cmsys::SystemTools::GetLineFromStream
                                 ((istream *)local_238,(string *)local_3b0,(bool *)0x0,
                                  0xffffffffffffffff), bVar4) {
          std::__cxx11::string::_M_append((char *)psVar6,local_3b0._0_8_);
          std::__cxx11::string::append((char *)psVar6);
        }
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,
                          CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,
                                   local_3a0[0]._M_local_buf[0]) + 1);
        }
      }
      else {
        std::operator+(&local_408,"Cannot read memory tester output file: ",&local_428);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b0,local_408._M_dataplus._M_p,
                            local_408._M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x51c,(char *)local_3d0,false);
        if (local_3d0 != local_3c0) {
          operator_delete(local_3d0,local_3c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
      }
      std::ifstream::~ifstream(local_238);
      if ((uVar1 & 5) == 0) {
        cmsys::SystemTools::Delay(1000);
        cmsys::SystemTools::RemoveFile(&this->BoundsCheckerDPBDFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Remove: ",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,(this->BoundsCheckerDPBDFile)._M_dataplus._M_p,
                            (this->BoundsCheckerDPBDFile)._M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x52b,(char *)local_3b0._0_8_,
                     (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,
                          CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,
                                   local_3a0[0]._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
        cmsys::SystemTools::RemoveFile(&this->BoundsCheckerXMLFile);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Remove: ",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,(this->BoundsCheckerXMLFile)._M_dataplus._M_p,
                            (this->BoundsCheckerXMLFile)._M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x52f,(char *)local_3b0._0_8_,
                     (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,
                          CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,
                                   local_3a0[0]._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8);
  return;
}

Assistant:

void cmCTestMemCheckHandler::PostProcessBoundsCheckerTest(
  cmCTestTestResult& res, int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "PostProcessBoundsCheckerTest for : " << res.Name
                                                           << std::endl,
                     this->Quiet);
  std::vector<std::string> files;
  this->TestOutputFileNames(test, files);
  if (files.empty()) {
    return;
  }
  std::string ofile = files[0];
  if (ofile.empty()) {
    return;
  }
  // put a scope around this to close ifs so the file can be removed
  {
    cmsys::ifstream ifs(ofile.c_str());
    if (!ifs) {
      std::string log = "Cannot read memory tester output file: " + ofile;
      cmCTestLog(this->CTest, ERROR_MESSAGE, log << std::endl);
      return;
    }
    res.Output += BOUNDS_CHECKER_MARKER;
    res.Output += "\n";
    std::string line;
    while (cmSystemTools::GetLineFromStream(ifs, line)) {
      res.Output += line;
      res.Output += "\n";
    }
  }
  cmSystemTools::Delay(1000);
  cmSystemTools::RemoveFile(this->BoundsCheckerDPBDFile);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Remove: " << this->BoundsCheckerDPBDFile << std::endl,
                     this->Quiet);
  cmSystemTools::RemoveFile(this->BoundsCheckerXMLFile);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Remove: " << this->BoundsCheckerXMLFile << std::endl,
                     this->Quiet);
}